

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

IEventListenerPtr __thiscall
Catch::anon_unknown_26::createReporter
          (anon_unknown_26 *this,string *reporterName,ReporterConfig *config)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  ReusableStringStream *pRVar4;
  char local_69;
  ReusableStringStream local_68;
  string local_58;
  undefined1 local_21;
  ReporterConfig *local_20;
  ReporterConfig *config_local;
  string *reporterName_local;
  IEventListenerPtr *reporter;
  
  local_21 = 0;
  local_20 = config;
  config_local = (ReporterConfig *)reporterName;
  reporterName_local = (string *)this;
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
  ReporterRegistry::create
            ((ReporterRegistry *)this,(string *)CONCAT44(extraout_var,iVar2),config_local);
  bVar1 = Detail::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (bVar1) {
    return (IEventListenerPtr)(IEventListener *)this;
  }
  ReusableStringStream::ReusableStringStream(&local_68);
  pRVar4 = ReusableStringStream::operator<<
                     (&local_68,(char (*) [36])"No reporter registered with name: \'");
  pRVar4 = ReusableStringStream::operator<<
                     (pRVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             config_local);
  local_69 = '\'';
  pRVar4 = ReusableStringStream::operator<<(pRVar4,&local_69);
  ReusableStringStream::str_abi_cxx11_(&local_58,pRVar4);
  throw_domain_error(&local_58);
}

Assistant:

IEventListenerPtr createReporter(std::string const& reporterName, ReporterConfig&& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, CATCH_MOVE(config));
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << '\'');

            return reporter;
        }